

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_cfg.cpp
# Opt level: O0

void spvtools::val::printDominatorList(BasicBlock *b)

{
  uint32_t uVar1;
  ostream *poVar2;
  BasicBlock *pBVar3;
  BasicBlock *local_18;
  BasicBlock *bb;
  BasicBlock *b_local;
  
  uVar1 = BasicBlock::id(b);
  poVar2 = (ostream *)std::ostream::operator<<(&std::cout,uVar1);
  std::operator<<(poVar2," is dominated by: ");
  local_18 = b;
  while( true ) {
    pBVar3 = BasicBlock::immediate_dominator(local_18);
    if (pBVar3 == local_18) break;
    local_18 = BasicBlock::immediate_dominator(local_18);
    uVar1 = BasicBlock::id(local_18);
    poVar2 = (ostream *)std::ostream::operator<<(&std::cout,uVar1);
    std::operator<<(poVar2," ");
  }
  return;
}

Assistant:

void printDominatorList(const BasicBlock& b) {
  std::cout << b.id() << " is dominated by: ";
  const BasicBlock* bb = &b;
  while (bb->immediate_dominator() != bb) {
    bb = bb->immediate_dominator();
    std::cout << bb->id() << " ";
  }
}